

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O2

int apply_skip_certs(ASN1_INTEGER *skip_certs,size_t *value)

{
  int iVar1;
  uint64_t in_RAX;
  int iVar2;
  uint64_t u64;
  
  iVar2 = 1;
  if (skip_certs != (ASN1_INTEGER *)0x0) {
    if ((skip_certs->type & 0x100) == 0) {
      u64 = in_RAX;
      iVar1 = ASN1_INTEGER_get_uint64(&u64,skip_certs);
      if ((iVar1 != 0) && (u64 < *value)) {
        *value = u64;
      }
      ERR_clear_error();
    }
    else {
      iVar2 = 0;
      ERR_put_error(0xb,0,0x90,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x210);
    }
  }
  return iVar2;
}

Assistant:

static int apply_skip_certs(const ASN1_INTEGER *skip_certs, size_t *value) {
  if (skip_certs == NULL) {
    return 1;
  }

  // TODO(https://crbug.com/boringssl/443): Move this check into the parser.
  if (skip_certs->type & V_ASN1_NEG) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
    return 0;
  }

  // If |skip_certs| does not fit in |uint64_t|, it must exceed |*value|.
  uint64_t u64;
  if (ASN1_INTEGER_get_uint64(&u64, skip_certs) && u64 < *value) {
    *value = (size_t)u64;
  }
  ERR_clear_error();
  return 1;
}